

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,REF_NODE ref_node)

{
  size_t __size;
  int iVar1;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  REF_CLOUD pRVar4;
  undefined1 auVar5 [16];
  REF_MPI pRVar6;
  uint uVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  REF_INT *send_size;
  REF_INT *recv_size;
  REF_INT *recv_size_00;
  REF_INT *send_size_00;
  void *pvVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  REF_DBL *pRVar17;
  char *pcVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  REF_INT local;
  int local_c4;
  long local_c0;
  REF_MPI local_b8;
  ulong local_b0;
  void *local_a8;
  undefined4 *local_a0;
  REF_NODE local_98;
  void *local_90;
  ulong local_88;
  void *local_80;
  undefined1 local_78 [16];
  REF_MPI local_68;
  void *local_60;
  void *local_58;
  undefined4 *local_50;
  REF_CLOUD *local_48;
  void *local_40;
  long local_38;
  
  local_b8 = ref_node->ref_mpi;
  uVar7 = local_b8->n;
  if ((long)(int)uVar7 < 2) {
    return 0;
  }
  __size = (long)(int)uVar7 * 4;
  puVar8 = (undefined4 *)calloc(1,__size);
  if (puVar8 == (undefined4 *)0x0) {
    pcVar18 = "malloc a_next of REF_INT NULL";
    uVar14 = 0x321;
    goto LAB_001a32a3;
  }
  puVar9 = (undefined4 *)calloc(1,__size);
  if (puVar9 == (undefined4 *)0x0) {
    pcVar18 = "malloc b_next of REF_INT NULL";
    uVar14 = 0x322;
    goto LAB_001a32a3;
  }
  local_48 = one_layer;
  send_size = (REF_INT *)malloc(__size);
  auVar5 = _DAT_00200a10;
  if (send_size == (REF_INT *)0x0) {
    pcVar18 = "malloc a_nnode of REF_INT NULL";
    uVar14 = 0x323;
    goto LAB_001a32a3;
  }
  uVar16 = (ulong)uVar7 + 3;
  lVar12 = (ulong)uVar7 - 1;
  auVar27._8_4_ = (int)lVar12;
  auVar27._0_8_ = lVar12;
  auVar27._12_4_ = (int)((ulong)lVar12 >> 0x20);
  lVar12 = 0;
  local_78 = auVar27 ^ _DAT_00200a10;
  auVar28 = _DAT_00202f40;
  auVar23 = _DAT_00200a00;
  do {
    auVar27 = auVar23 ^ auVar5;
    iVar11 = local_78._4_4_;
    if ((bool)(~(auVar27._4_4_ == iVar11 && local_78._0_4_ < auVar27._0_4_ || iVar11 < auVar27._4_4_
                ) & 1)) {
      *(undefined4 *)((long)send_size + lVar12) = 0;
    }
    if ((auVar27._12_4_ != local_78._12_4_ || auVar27._8_4_ <= local_78._8_4_) &&
        auVar27._12_4_ <= local_78._12_4_) {
      *(undefined4 *)((long)send_size + lVar12 + 4) = 0;
    }
    auVar27 = auVar28 ^ auVar5;
    iVar29 = auVar27._4_4_;
    if (iVar29 <= iVar11 && (iVar29 != iVar11 || auVar27._0_4_ <= local_78._0_4_)) {
      *(undefined4 *)((long)send_size + lVar12 + 8) = 0;
      *(undefined4 *)((long)send_size + lVar12 + 0xc) = 0;
    }
    lVar13 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 4;
    auVar23._8_8_ = lVar13 + 4;
    lVar13 = auVar28._8_8_;
    auVar28._0_8_ = auVar28._0_8_ + 4;
    auVar28._8_8_ = lVar13 + 4;
    lVar12 = lVar12 + 0x10;
  } while ((uVar16 >> 2 & 0x3fffffff) << 4 != lVar12);
  local_a0 = puVar9;
  local_98 = ref_node;
  local_50 = puVar8;
  recv_size = (REF_INT *)malloc(__size);
  auVar5 = _DAT_00200a10;
  if (recv_size == (REF_INT *)0x0) {
    pcVar18 = "malloc b_nnode of REF_INT NULL";
    uVar14 = 0x324;
    goto LAB_001a32a3;
  }
  lVar12 = 0;
  auVar20 = _DAT_00202f40;
  auVar24 = _DAT_00200a00;
  do {
    auVar28 = auVar24 ^ auVar5;
    if ((bool)(~(auVar28._4_4_ == local_78._4_4_ && (int)local_78._0_4_ < auVar28._0_4_ ||
                (int)local_78._4_4_ < auVar28._4_4_) & 1)) {
      *(undefined4 *)((long)recv_size + lVar12) = 0;
    }
    if ((auVar28._12_4_ != local_78._12_4_ || auVar28._8_4_ <= (int)local_78._8_4_) &&
        auVar28._12_4_ <= (int)local_78._12_4_) {
      *(undefined4 *)((long)recv_size + lVar12 + 4) = 0;
    }
    auVar28 = auVar20 ^ auVar5;
    iVar11 = auVar28._4_4_;
    if (iVar11 <= (int)local_78._4_4_ &&
        (iVar11 != local_78._4_4_ || auVar28._0_4_ <= (int)local_78._0_4_)) {
      *(undefined4 *)((long)recv_size + lVar12 + 8) = 0;
      *(undefined4 *)((long)recv_size + lVar12 + 0xc) = 0;
    }
    lVar13 = auVar24._8_8_;
    auVar24._0_8_ = auVar24._0_8_ + 4;
    auVar24._8_8_ = lVar13 + 4;
    lVar13 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 4;
    auVar20._8_8_ = lVar13 + 4;
    lVar12 = lVar12 + 0x10;
  } while ((uVar16 >> 2 & 0x3fffffff) << 4 != lVar12);
  recv_size_00 = (REF_INT *)malloc(__size);
  auVar5 = _DAT_00200a10;
  if (recv_size_00 == (REF_INT *)0x0) {
    pcVar18 = "malloc a_ncloud of REF_INT NULL";
    uVar14 = 0x325;
    goto LAB_001a32a3;
  }
  lVar12 = 0;
  auVar21 = _DAT_00202f40;
  auVar25 = _DAT_00200a00;
  do {
    auVar28 = auVar25 ^ auVar5;
    if ((bool)(~(auVar28._4_4_ == local_78._4_4_ && (int)local_78._0_4_ < auVar28._0_4_ ||
                (int)local_78._4_4_ < auVar28._4_4_) & 1)) {
      *(undefined4 *)((long)recv_size_00 + lVar12) = 0;
    }
    if ((auVar28._12_4_ != local_78._12_4_ || auVar28._8_4_ <= (int)local_78._8_4_) &&
        auVar28._12_4_ <= (int)local_78._12_4_) {
      *(undefined4 *)((long)recv_size_00 + lVar12 + 4) = 0;
    }
    auVar28 = auVar21 ^ auVar5;
    iVar11 = auVar28._4_4_;
    if (iVar11 <= (int)local_78._4_4_ &&
        (iVar11 != local_78._4_4_ || auVar28._0_4_ <= (int)local_78._0_4_)) {
      *(undefined4 *)((long)recv_size_00 + lVar12 + 8) = 0;
      *(undefined4 *)((long)recv_size_00 + lVar12 + 0xc) = 0;
    }
    lVar13 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 4;
    auVar25._8_8_ = lVar13 + 4;
    lVar13 = auVar21._8_8_;
    auVar21._0_8_ = auVar21._0_8_ + 4;
    auVar21._8_8_ = lVar13 + 4;
    lVar12 = lVar12 + 0x10;
  } while ((uVar16 >> 2 & 0x3fffffff) << 4 != lVar12);
  send_size_00 = (REF_INT *)malloc(__size);
  pRVar6 = local_b8;
  auVar5 = _DAT_00200a10;
  if (send_size_00 == (REF_INT *)0x0) {
    pcVar18 = "malloc b_ncloud of REF_INT NULL";
    uVar14 = 0x326;
    goto LAB_001a32a3;
  }
  lVar12 = 0;
  auVar22 = _DAT_00202f40;
  auVar26 = _DAT_00200a00;
  do {
    auVar28 = auVar26 ^ auVar5;
    if ((bool)(~(auVar28._4_4_ == local_78._4_4_ && (int)local_78._0_4_ < auVar28._0_4_ ||
                (int)local_78._4_4_ < auVar28._4_4_) & 1)) {
      *(undefined4 *)((long)send_size_00 + lVar12) = 0;
    }
    if ((auVar28._12_4_ != local_78._12_4_ || auVar28._8_4_ <= (int)local_78._8_4_) &&
        auVar28._12_4_ <= (int)local_78._12_4_) {
      *(undefined4 *)((long)send_size_00 + lVar12 + 4) = 0;
    }
    auVar28 = auVar22 ^ auVar5;
    iVar11 = auVar28._4_4_;
    if (iVar11 <= (int)local_78._4_4_ &&
        (iVar11 != local_78._4_4_ || auVar28._0_4_ <= (int)local_78._0_4_)) {
      *(undefined4 *)((long)send_size_00 + lVar12 + 8) = 0;
      *(undefined4 *)((long)send_size_00 + lVar12 + 0xc) = 0;
    }
    lVar13 = auVar26._8_8_;
    auVar26._0_8_ = auVar26._0_8_ + 4;
    auVar26._8_8_ = lVar13 + 4;
    lVar13 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 4;
    auVar22._8_8_ = lVar13 + 4;
    lVar12 = lVar12 + 0x10;
  } while ((ulong)(uVar7 + 3 >> 2) << 4 != lVar12);
  iVar11 = local_98->max;
  if (0 < (long)iVar11) {
    pRVar2 = local_98->global;
    lVar12 = 0;
    do {
      if ((-1 < pRVar2[lVar12]) && (local_b8->id != local_98->part[lVar12])) {
        send_size[local_98->part[lVar12]] = send_size[local_98->part[lVar12]] + 1;
      }
      lVar12 = lVar12 + 1;
    } while (iVar11 != lVar12);
  }
  uVar7 = ref_mpi_alltoall(local_b8,send_size,recv_size,1);
  if (uVar7 != 0) {
    pcVar18 = "alltoall nnodes";
    uVar14 = 0x330;
    goto LAB_001a31be;
  }
  iVar11 = pRVar6->n;
  lVar12 = (long)iVar11;
  if (lVar12 < 1) {
    uVar7 = 0;
  }
  else {
    lVar13 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + send_size[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
    if ((int)uVar7 < 0) {
      pcVar18 = "malloc a_global of REF_GLOB negative";
      uVar14 = 0x334;
      goto LAB_001a338a;
    }
  }
  local_40 = malloc((ulong)uVar7 * 8);
  if (local_40 == (void *)0x0) {
    pcVar18 = "malloc a_global of REF_GLOB NULL";
    uVar14 = 0x334;
  }
  else {
    pvVar10 = malloc((ulong)uVar7 << 2);
    puVar8 = local_50;
    local_78._0_8_ = pvVar10;
    if (pvVar10 == (void *)0x0) {
      pcVar18 = "malloc a_part of REF_INT NULL";
      uVar14 = 0x335;
      goto LAB_001a32a3;
    }
    if (iVar11 < 1) {
      uVar7 = 0;
    }
    else {
      lVar13 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + recv_size[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
      if ((int)uVar7 < 0) {
        pcVar18 = "malloc b_global of REF_GLOB negative";
        uVar14 = 0x339;
        goto LAB_001a338a;
      }
    }
    local_b0 = (ulong)uVar7;
    pvVar10 = malloc(local_b0 * 8);
    if (pvVar10 == (void *)0x0) {
      pcVar18 = "malloc b_global of REF_GLOB NULL";
      uVar14 = 0x339;
      goto LAB_001a32a3;
    }
    local_a8 = pvVar10;
    local_80 = malloc(local_b0 * 4);
    pRVar6 = local_b8;
    if (local_80 == (void *)0x0) {
      pcVar18 = "malloc b_part of REF_INT NULL";
      uVar14 = 0x33a;
      goto LAB_001a32a3;
    }
    *puVar8 = 0;
    if (1 < iVar11) {
      lVar13 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + send_size[lVar13];
        puVar8[lVar13 + 1] = iVar11;
        lVar13 = lVar13 + 1;
      } while (lVar12 + -1 != lVar13);
    }
    iVar11 = local_98->max;
    if (0 < (long)iVar11) {
      pRVar2 = local_98->global;
      lVar12 = 0;
      do {
        if (-1 < pRVar2[lVar12]) {
          iVar29 = local_b8->id;
          pRVar3 = local_98->part;
          iVar1 = pRVar3[lVar12];
          if (iVar29 != iVar1) {
            iVar1 = puVar8[iVar1];
            *(REF_GLOB *)((long)local_40 + (long)iVar1 * 8) = pRVar2[lVar12];
            *(int *)(local_78._0_8_ + (long)iVar1 * 4) = iVar29;
            puVar8[pRVar3[lVar12]] = puVar8[pRVar3[lVar12]] + 1;
          }
        }
        lVar12 = lVar12 + 1;
      } while (iVar11 != lVar12);
    }
    uVar7 = ref_mpi_alltoallv(local_b8,local_40,send_size,local_a8,recv_size,1,2);
    if (uVar7 != 0) {
      pcVar18 = "alltoallv global";
      uVar14 = 0x34c;
LAB_001a31be:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
             uVar14,"ref_recon_ghost_cloud",(ulong)uVar7,pcVar18);
      return uVar7;
    }
    uVar7 = ref_mpi_alltoallv(pRVar6,(void *)local_78._0_8_,send_size,local_80,recv_size,1,1);
    if (uVar7 != 0) {
      pcVar18 = "alltoallv part";
      uVar14 = 0x34f;
      goto LAB_001a31be;
    }
    if (local_b0 != 0) {
      uVar16 = 0;
      do {
        uVar7 = ref_node_local(local_98,*(REF_GLOB *)((long)local_a8 + uVar16 * 8),&local_c4);
        if (uVar7 != 0) {
          pcVar18 = "g2l";
          uVar14 = 0x353;
          goto LAB_001a31be;
        }
        send_size_00[*(int *)((long)local_80 + uVar16 * 4)] =
             send_size_00[*(int *)((long)local_80 + uVar16 * 4)] + local_48[local_c4]->n;
        uVar16 = uVar16 + 1;
      } while (local_b0 != uVar16);
    }
    pRVar6 = local_b8;
    uVar7 = ref_mpi_alltoall(local_b8,send_size_00,recv_size_00,1);
    if (uVar7 != 0) {
      pcVar18 = "alltoall nclouds";
      uVar14 = 0x35a;
      goto LAB_001a31be;
    }
    local_c0 = (long)pRVar6->n;
    if (local_c0 < 1) {
      uVar15 = 0;
    }
    else {
      lVar12 = 0;
      uVar15 = 0;
      do {
        uVar15 = uVar15 + recv_size_00[lVar12];
        lVar12 = lVar12 + 1;
      } while (local_c0 != lVar12);
      if ((int)uVar15 < 0) {
        pcVar18 = "malloc a_keyval of REF_GLOB negative";
        uVar14 = 0x35e;
        goto LAB_001a338a;
      }
    }
    local_90 = malloc((ulong)(uVar15 * 2) << 3);
    if (local_90 == (void *)0x0) {
      pcVar18 = "malloc a_keyval of REF_GLOB NULL";
      uVar14 = 0x35e;
    }
    else {
      local_68 = (REF_MPI)malloc((ulong)(uVar15 * 4) << 3);
      if (local_68 == (REF_MPI)0x0) {
        pcVar18 = "malloc a_aux of REF_DBL NULL";
        uVar14 = 0x35f;
      }
      else {
        if ((int)local_c0 < 1) {
          iVar11 = 0;
        }
        else {
          lVar12 = 0;
          iVar11 = 0;
          do {
            iVar11 = iVar11 + send_size_00[lVar12];
            lVar12 = lVar12 + 1;
          } while (local_c0 != lVar12);
          if (iVar11 < 0) {
            pcVar18 = "malloc b_keyval of REF_GLOB negative";
            uVar14 = 0x363;
LAB_001a338a:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,uVar14,"ref_recon_ghost_cloud",pcVar18);
            return 1;
          }
        }
        local_58 = malloc((ulong)(uint)(iVar11 * 2) << 3);
        if (local_58 == (void *)0x0) {
          pcVar18 = "malloc b_keyval of REF_GLOB NULL";
          uVar14 = 0x363;
        }
        else {
          local_60 = malloc((ulong)(uint)(iVar11 << 2) << 3);
          if (local_60 != (void *)0x0) {
            *local_a0 = 0;
            if (1 < (int)local_c0) {
              local_c0 = local_c0 + -1;
              lVar12 = 0;
              iVar11 = 0;
              do {
                iVar11 = iVar11 + send_size_00[lVar12];
                local_a0[lVar12 + 1] = iVar11;
                lVar12 = lVar12 + 1;
              } while (local_c0 != lVar12);
            }
            if (local_b0 != 0) {
              local_88 = 0;
              do {
                uVar7 = ref_node_local(local_98,*(REF_GLOB *)((long)local_a8 + local_88 * 8),
                                       &local_c4);
                if (uVar7 != 0) {
                  pcVar18 = "g2l";
                  uVar14 = 0x36c;
                  goto LAB_001a31be;
                }
                pRVar4 = local_48[local_c4];
                local_c0 = (long)pRVar4->n;
                if (0 < local_c0) {
                  local_38 = (long)*(int *)((long)local_80 + local_88 * 4);
                  uVar14 = *(undefined8 *)((long)local_a8 + local_88 * 8);
                  pRVar2 = pRVar4->global;
                  pRVar17 = pRVar4->aux;
                  iVar11 = pRVar4->naux;
                  lVar12 = (long)(int)local_a0[local_38];
                  pvVar10 = (void *)(lVar12 * 0x20 + (long)local_60);
                  lVar13 = 0;
                  do {
                    *(undefined8 *)((long)local_58 + lVar12 * 0x10) = uVar14;
                    *(REF_GLOB *)((long)local_58 + lVar12 * 0x10 + 8) = pRVar2[lVar13];
                    lVar19 = 0;
                    do {
                      *(REF_DBL *)((long)pvVar10 + lVar19 * 8) = pRVar17[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 4);
                    lVar12 = lVar12 + 1;
                    lVar13 = lVar13 + 1;
                    pvVar10 = (void *)((long)pvVar10 + 0x20);
                    pRVar17 = pRVar17 + iVar11;
                  } while (lVar13 != local_c0);
                  local_a0[local_38] = (int)lVar12;
                }
                local_88 = local_88 + 1;
              } while (local_88 != local_b0);
            }
            uVar7 = ref_mpi_alltoallv(local_b8,local_58,send_size_00,local_90,recv_size_00,2,2);
            if (uVar7 == 0) {
              uVar7 = ref_mpi_alltoallv(local_b8,local_60,send_size_00,local_68,recv_size_00,4,3);
              if (uVar7 == 0) {
                if (uVar15 != 0) {
                  local_b0 = (ulong)uVar15 << 4;
                  uVar16 = 0;
                  local_b8 = local_68;
                  do {
                    uVar7 = ref_node_local(local_98,*(REF_GLOB *)((long)local_90 + uVar16),&local_c4
                                          );
                    if (uVar7 != 0) {
                      pcVar18 = "g2l";
                      uVar14 = 900;
                      goto LAB_001a31be;
                    }
                    uVar7 = ref_cloud_store(local_48[local_c4],
                                            *(REF_GLOB *)((long)local_90 + uVar16 + 8),
                                            (REF_DBL *)local_b8);
                    if (uVar7 != 0) {
                      pcVar18 = "add ghost";
                      uVar14 = 0x388;
                      goto LAB_001a31be;
                    }
                    local_b8 = (REF_MPI)&local_b8->first_time;
                    uVar16 = uVar16 + 0x10;
                  } while (local_b0 != uVar16);
                }
                free(local_60);
                free(local_58);
                free(local_68);
                free(local_90);
                free(local_80);
                free(local_a8);
                free((void *)local_78._0_8_);
                free(local_40);
                free(send_size_00);
                free(recv_size_00);
                free(recv_size);
                free(send_size);
                free(local_a0);
                free(local_50);
                return 0;
              }
              pcVar18 = "alltoallv aux";
              uVar14 = 0x380;
            }
            else {
              pcVar18 = "alltoallv keyval";
              uVar14 = 0x37d;
            }
            goto LAB_001a31be;
          }
          pcVar18 = "malloc b_aux of REF_DBL NULL";
          uVar14 = 0x364;
          local_60 = (void *)0x0;
        }
      }
    }
  }
LAB_001a32a3:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar14,
         "ref_recon_ghost_cloud",pcVar18);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,
                                         REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_CLOUD ref_cloud;
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ncloud, *b_ncloud;
  REF_INT a_ncloud_total, b_ncloud_total;
  REF_GLOB *a_keyval, *b_keyval;
  REF_DBL *a_aux, *b_aux;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, cloud, key_index, aux_index;
  REF_GLOB global;
  REF_INT nkeyval = 2, naux = 4;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);

  /* ghost nodes need to fill */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv part");

  /* degree of these node cloud to send */
  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    degree = ref_cloud_n(one_layer[local]);
    b_ncloud[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ncloud, a_ncloud, REF_INT_TYPE),
      "alltoall nclouds");

  a_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ncloud_total += a_ncloud[part];
  ref_malloc(a_keyval, nkeyval * a_ncloud_total, REF_GLOB);
  ref_malloc(a_aux, naux * a_ncloud_total, REF_DBL);

  b_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ncloud_total += b_ncloud[part];
  ref_malloc(b_keyval, nkeyval * b_ncloud_total, REF_GLOB);
  ref_malloc(b_aux, naux * b_ncloud_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ncloud[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    ref_cloud = one_layer[local];
    each_ref_cloud_item(ref_cloud, key_index) {
      b_keyval[0 + nkeyval * b_next[part]] = b_global[node];
      b_keyval[1 + nkeyval * b_next[part]] =
          ref_cloud_global(ref_cloud, key_index);
      for (aux_index = 0; aux_index < naux; aux_index++) {
        b_aux[aux_index + naux * b_next[part]] =
            ref_cloud_aux(ref_cloud, aux_index, key_index);
      }
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_keyval, b_ncloud, a_keyval, a_ncloud,
                        nkeyval, REF_GLOB_TYPE),
      "alltoallv keyval");
  RSS(ref_mpi_alltoallv(ref_mpi, b_aux, b_ncloud, a_aux, a_ncloud, naux,
                        REF_DBL_TYPE),
      "alltoallv aux");

  for (cloud = 0; cloud < a_ncloud_total; cloud++) {
    global = a_keyval[0 + nkeyval * cloud];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    ref_cloud = one_layer[local];
    RSS(ref_cloud_store(ref_cloud, a_keyval[1 + nkeyval * cloud],
                        &(a_aux[naux * cloud])),
        "add ghost");
  }

  free(b_aux);
  free(b_keyval);
  free(a_aux);
  free(a_keyval);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ncloud);
  free(a_ncloud);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}